

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.cpp
# Opt level: O0

void __thiscall ezc3d::ParametersNS::GroupNS::Parameter::set(Parameter *this,double data)

{
  initializer_list<double> __l;
  vector<double,_std::allocator<double>_> *this_00;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff80;
  iterator in_stack_ffffffffffffff88;
  size_type in_stack_ffffffffffffff90;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffa0;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffffa8;
  Parameter *in_stack_ffffffffffffffb0;
  undefined1 local_28 [8];
  undefined1 *local_20;
  undefined8 local_18;
  
  local_20 = local_28;
  local_18 = 1;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x16730a);
  __l._M_len = in_stack_ffffffffffffff90;
  __l._M_array = in_stack_ffffffffffffff88;
  this_00 = std::vector<double,_std::allocator<double>_>::operator=(in_stack_ffffffffffffff80,__l);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x167347);
  set(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
  std::vector<double,_std::allocator<double>_>::~vector(this_00);
  return;
}

Assistant:

void ezc3d::ParametersNS::GroupNS::Parameter::set(double data) {
  set(std::vector<double>() = {data});
}